

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O0

aom_codec_err_t
aom_codec_enc_config_default(aom_codec_iface_t *iface,aom_codec_enc_cfg_t *cfg,uint usage)

{
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  int i;
  aom_codec_err_t res;
  int local_1c;
  aom_codec_err_t local_18;
  
  if ((in_RDI == 0) || (in_RSI == (void *)0x0)) {
    local_18 = AOM_CODEC_INVALID_PARAM;
  }
  else if ((*(ulong *)(in_RDI + 0x10) & 2) == 0) {
    local_18 = AOM_CODEC_INCAPABLE;
  }
  else {
    local_18 = AOM_CODEC_INVALID_PARAM;
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x58); local_1c = local_1c + 1) {
      if (*(int *)(*(long *)(in_RDI + 0x60) + (long)local_1c * 0x388) == in_EDX) {
        memcpy(in_RSI,(void *)(*(long *)(in_RDI + 0x60) + (long)local_1c * 0x388),0x388);
        memset((void *)((long)in_RSI + 0x2fc),0,0x8c);
        *(undefined4 *)((long)in_RSI + 0x300) = 0;
        *(undefined4 *)((long)in_RSI + 0x304) = 0x80;
        *(undefined4 *)((long)in_RSI + 0x308) = 4;
        *(undefined4 *)((long)in_RSI + 0x378) = 3;
        return AOM_CODEC_OK;
      }
    }
  }
  return local_18;
}

Assistant:

aom_codec_err_t aom_codec_enc_config_default(aom_codec_iface_t *iface,
                                             aom_codec_enc_cfg_t *cfg,
                                             unsigned int usage) {
  aom_codec_err_t res;

  if (!iface || !cfg)
    res = AOM_CODEC_INVALID_PARAM;
  else if (!(iface->caps & AOM_CODEC_CAP_ENCODER))
    res = AOM_CODEC_INCAPABLE;
  else {
    res = AOM_CODEC_INVALID_PARAM;

    for (int i = 0; i < iface->enc.cfg_count; ++i) {
      if (iface->enc.cfgs[i].g_usage == usage) {
        *cfg = iface->enc.cfgs[i];
        res = AOM_CODEC_OK;
        /* default values */
        memset(&cfg->encoder_cfg, 0, sizeof(cfg->encoder_cfg));
        cfg->encoder_cfg.super_block_size = 0;  // Dynamic
        cfg->encoder_cfg.max_partition_size = 128;
        cfg->encoder_cfg.min_partition_size = 4;
        cfg->encoder_cfg.disable_trellis_quant = 3;
        break;
      }
    }
  }
  return res;
}